

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_div(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  mp_int *in_RCX;
  mp_int *in_RDX;
  mp_int *in_RSI;
  mp_int *in_RDI;
  undefined1 auVar7 [16];
  mp_word tmp;
  int neg;
  int norm;
  int i;
  int t;
  int n;
  int res;
  mp_int t2;
  mp_int t1;
  mp_int y;
  mp_int x;
  mp_int q;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  mp_int *in_stack_ffffffffffffff20;
  mp_int *in_stack_ffffffffffffff28;
  mp_int *b_00;
  mp_int *in_stack_ffffffffffffff30;
  mp_int *a_00;
  mp_int *in_stack_ffffffffffffff38;
  int local_b0;
  uint in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  mp_int *in_stack_ffffffffffffff68;
  mp_int *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff84;
  mp_int *in_stack_ffffffffffffff88;
  mp_int local_70;
  mp_int local_58;
  mp_int local_40;
  mp_int *local_28;
  mp_int *local_20;
  mp_int *local_18;
  mp_int *local_10;
  
  if (in_RSI->used == 0) {
    return -3;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar3 = mp_cmp_mag(in_RDI,in_RSI);
  if (iVar3 == -1) {
    if (local_28 == (mp_int *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = mp_copy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    }
    if (local_20 == (mp_int *)0x0) {
      return iVar3;
    }
    mp_zero(local_20);
    return iVar3;
  }
  iVar3 = mp_init_size((mp_int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
  if (iVar3 != 0) {
    return iVar3;
  }
  local_40.used = local_10->used + 2;
  iVar3 = mp_init((mp_int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (iVar3 != 0) goto LAB_0010811e;
  iVar3 = mp_init((mp_int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (iVar3 == 0) {
    iVar3 = mp_init_copy(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    if (iVar3 == 0) {
      iVar3 = mp_init_copy(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if (iVar3 == 0) {
        iVar1 = local_10->sign;
        iVar2 = local_18->sign;
        local_70.sign = 0;
        local_58.sign = 0;
        iVar4 = mp_count_bits(&local_70);
        if ((0x3a < iVar4 % 0x3c) ||
           ((iVar3 = mp_mul_2d(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                               (mp_int *)CONCAT44(iVar3,in_stack_ffffffffffffff58)), iVar3 == 0 &&
            (iVar3 = mp_mul_2d(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                               (mp_int *)(ulong)in_stack_ffffffffffffff58), iVar3 == 0)))) {
          local_b0 = local_58.used + -1;
          iVar4 = local_70.used + -1;
          iVar3 = mp_lshd(in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20))
          ;
          while (iVar3 == 0) {
            iVar3 = 0;
            iVar5 = mp_cmp((mp_int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (mp_int *)0x107b7b);
            if (iVar5 == -1) {
              mp_rshd(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
              iVar5 = local_b0;
              goto LAB_00107bde;
            }
            local_40.dp[local_b0 - iVar4] = local_40.dp[local_b0 - iVar4] + 1;
            iVar3 = mp_sub(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff20);
          }
        }
        goto LAB_001080f3;
      }
      goto LAB_001080fd;
    }
    goto LAB_0010810a;
  }
LAB_00108114:
  mp_clear(in_stack_ffffffffffffff20);
LAB_0010811e:
  mp_clear(in_stack_ffffffffffffff20);
  return iVar3;
LAB_00107bde:
  if (local_b0 < local_70.used) goto LAB_0010804b;
  if (local_b0 <= local_58.used) {
    if (local_58.dp[local_b0] == local_70.dp[iVar4]) {
      local_40.dp[(local_b0 - iVar4) + -1] = 0xfffffffffffffff;
    }
    else {
      auVar7 = __udivti3(local_58.dp[local_b0] << 0x3c | local_58.dp[local_b0 + -1],
                         local_58.dp[local_b0] >> 4,local_70.dp[iVar4],0);
      in_stack_ffffffffffffff38 = auVar7._0_8_;
      if ((ulong)in_stack_ffffffffffffff38 >> 0x3c != 0 || auVar7._8_8_ != 0) {
        in_stack_ffffffffffffff38 = (mp_int *)0xfffffffffffffff;
      }
      local_40.dp[(local_b0 - iVar4) + -1] = (ulong)in_stack_ffffffffffffff38 & 0xfffffffffffffff;
    }
    local_40.dp[(local_b0 - iVar4) + -1] =
         local_40.dp[(local_b0 - iVar4) + -1] + 1 & 0xfffffffffffffff;
    do {
      local_40.dp[(local_b0 - iVar4) + -1] =
           local_40.dp[(local_b0 - iVar4) + -1] - 1 & 0xfffffffffffffff;
      mp_zero((mp_int *)&stack0xffffffffffffff78);
      if (local_70.used + -2 < 0) {
        a_00 = (mp_int *)0x0;
      }
      else {
        a_00 = (mp_int *)local_70.dp[local_70.used + -2];
      }
      *(mp_int **)in_stack_ffffffffffffff88 = a_00;
      *(mp_digit *)&in_stack_ffffffffffffff88->sign = local_70.dp[iVar4];
      in_stack_ffffffffffffff78 = 2;
      iVar3 = mp_mul_d(in_stack_ffffffffffffff68,
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (mp_int *)CONCAT44(iVar3,iVar5));
      if (iVar3 != 0) goto LAB_001080f3;
      if (local_b0 + -2 < 0) {
        b_00 = (mp_int *)0x0;
      }
      else {
        b_00 = (mp_int *)local_58.dp[local_b0 + -2];
      }
      *(mp_int **)in_stack_ffffffffffffff70 = b_00;
      if (local_b0 + -1 < 0) {
        in_stack_ffffffffffffff20 = (mp_int *)0x0;
      }
      else {
        in_stack_ffffffffffffff20 = (mp_int *)local_58.dp[local_b0 + -1];
      }
      *(mp_int **)&in_stack_ffffffffffffff70->sign = in_stack_ffffffffffffff20;
      in_stack_ffffffffffffff70->dp = (mp_digit *)local_58.dp[local_b0];
      in_stack_ffffffffffffff60 = 3;
      iVar6 = mp_cmp_mag((mp_int *)&stack0xffffffffffffff78,(mp_int *)&stack0xffffffffffffff60);
    } while (iVar6 == 1);
    iVar3 = mp_mul_d(in_stack_ffffffffffffff68,
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (mp_int *)CONCAT44(iVar3,iVar5));
    if (((iVar3 != 0) ||
        (iVar3 = mp_lshd(in_stack_ffffffffffffff38,(int)((ulong)a_00 >> 0x20)), iVar3 != 0)) ||
       (iVar3 = mp_sub(a_00,b_00,in_stack_ffffffffffffff20), iVar3 != 0)) goto LAB_001080f3;
    if (local_58.sign == 1) {
      iVar3 = mp_copy(in_stack_ffffffffffffff38,a_00);
      if (((iVar3 != 0) ||
          (iVar3 = mp_lshd(in_stack_ffffffffffffff38,(int)((ulong)a_00 >> 0x20)), iVar3 != 0)) ||
         (iVar3 = mp_add(a_00,b_00,in_stack_ffffffffffffff20), iVar3 != 0)) goto LAB_001080f3;
      local_40.dp[(local_b0 - iVar4) + -1] =
           local_40.dp[(local_b0 - iVar4) + -1] - 1 & 0xfffffffffffffff;
    }
    iVar3 = 0;
  }
  local_b0 = local_b0 + -1;
  goto LAB_00107bde;
LAB_0010804b:
  if (local_58.used == 0) {
    local_58.sign = 0;
  }
  else {
    local_58.sign = local_10->sign;
  }
  if (local_20 != (mp_int *)0x0) {
    mp_clamp(&local_40);
    mp_exch(&local_40,local_20);
    local_20->sign = (uint)(iVar1 != iVar2);
  }
  if (local_28 != (mp_int *)0x0) {
    mp_div_2d(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
              (mp_int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
              in_stack_ffffffffffffff70);
    mp_exch(&local_58,local_28);
  }
  iVar3 = 0;
LAB_001080f3:
  mp_clear(in_stack_ffffffffffffff20);
LAB_001080fd:
  mp_clear(in_stack_ffffffffffffff20);
LAB_0010810a:
  mp_clear(in_stack_ffffffffffffff20);
  goto LAB_00108114;
}

Assistant:

int mp_div (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  mp_int  q, x, y, t1, t2;
  int     res, n, t, i, norm, neg;

  /* is divisor zero ? */
  if (mp_iszero (b) == 1) {
    return MP_VAL;
  }

  /* if a < b then q=0, r = a */
  if (mp_cmp_mag (a, b) == MP_LT) {
    if (d != NULL) {
      res = mp_copy (a, d);
    } else {
      res = MP_OKAY;
    }
    if (c != NULL) {
      mp_zero (c);
    }
    return res;
  }

  if ((res = mp_init_size (&q, a->used + 2)) != MP_OKAY) {
    return res;
  }
  q.used = a->used + 2;

  if ((res = mp_init (&t1)) != MP_OKAY) {
    goto LBL_Q;
  }

  if ((res = mp_init (&t2)) != MP_OKAY) {
    goto LBL_T1;
  }

  if ((res = mp_init_copy (&x, a)) != MP_OKAY) {
    goto LBL_T2;
  }

  if ((res = mp_init_copy (&y, b)) != MP_OKAY) {
    goto LBL_X;
  }

  /* fix the sign */
  neg = (a->sign == b->sign) ? MP_ZPOS : MP_NEG;
  x.sign = y.sign = MP_ZPOS;

  /* normalize both x and y, ensure that y >= b/2, [b == 2**DIGIT_BIT] */
  norm = mp_count_bits(&y) % DIGIT_BIT;
  if (norm < (int)(DIGIT_BIT-1)) {
     norm = (DIGIT_BIT-1) - norm;
     if ((res = mp_mul_2d (&x, norm, &x)) != MP_OKAY) {
       goto LBL_Y;
     }
     if ((res = mp_mul_2d (&y, norm, &y)) != MP_OKAY) {
       goto LBL_Y;
     }
  } else {
     norm = 0;
  }

  /* note hac does 0 based, so if used==5 then its 0,1,2,3,4, e.g. use 4 */
  n = x.used - 1;
  t = y.used - 1;

  /* while (x >= y*b**n-t) do { q[n-t] += 1; x -= y*b**{n-t} } */
  if ((res = mp_lshd (&y, n - t)) != MP_OKAY) { /* y = y*b**{n-t} */
    goto LBL_Y;
  }

  while (mp_cmp (&x, &y) != MP_LT) {
    ++(q.dp[n - t]);
    if ((res = mp_sub (&x, &y, &x)) != MP_OKAY) {
      goto LBL_Y;
    }
  }

  /* reset y by shifting it back down */
  mp_rshd (&y, n - t);

  /* step 3. for i from n down to (t + 1) */
  for (i = n; i >= (t + 1); i--) {
    if (i > x.used) {
      continue;
    }

    /* step 3.1 if xi == yt then set q{i-t-1} to b-1, 
     * otherwise set q{i-t-1} to (xi*b + x{i-1})/yt */
    if (x.dp[i] == y.dp[t]) {
      q.dp[i - t - 1] = ((((mp_digit)1) << DIGIT_BIT) - 1);
    } else {
      mp_word tmp;
      tmp = ((mp_word) x.dp[i]) << ((mp_word) DIGIT_BIT);
      tmp |= ((mp_word) x.dp[i - 1]);
      tmp /= ((mp_word) y.dp[t]);
      if (tmp > (mp_word) MP_MASK)
        tmp = MP_MASK;
      q.dp[i - t - 1] = (mp_digit) (tmp & (mp_word) (MP_MASK));
    }

    /* while (q{i-t-1} * (yt * b + y{t-1})) > 
             xi * b**2 + xi-1 * b + xi-2 
     
       do q{i-t-1} -= 1; 
    */
    q.dp[i - t - 1] = (q.dp[i - t - 1] + 1) & MP_MASK;
    do {
      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1) & MP_MASK;

      /* find left hand */
      mp_zero (&t1);
      t1.dp[0] = (t - 1 < 0) ? 0 : y.dp[t - 1];
      t1.dp[1] = y.dp[t];
      t1.used = 2;
      if ((res = mp_mul_d (&t1, q.dp[i - t - 1], &t1)) != MP_OKAY) {
        goto LBL_Y;
      }

      /* find right hand */
      t2.dp[0] = (i - 2 < 0) ? 0 : x.dp[i - 2];
      t2.dp[1] = (i - 1 < 0) ? 0 : x.dp[i - 1];
      t2.dp[2] = x.dp[i];
      t2.used = 3;
    } while (mp_cmp_mag(&t1, &t2) == MP_GT);

    /* step 3.3 x = x - q{i-t-1} * y * b**{i-t-1} */
    if ((res = mp_mul_d (&y, q.dp[i - t - 1], &t1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_sub (&x, &t1, &x)) != MP_OKAY) {
      goto LBL_Y;
    }

    /* if x < 0 then { x = x + y*b**{i-t-1}; q{i-t-1} -= 1; } */
    if (x.sign == MP_NEG) {
      if ((res = mp_copy (&y, &t1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_add (&x, &t1, &x)) != MP_OKAY) {
        goto LBL_Y;
      }

      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1UL) & MP_MASK;
    }
  }

  /* now q is the quotient and x is the remainder 
   * [which we have to normalize] 
   */
  
  /* get sign before writing to c */
  x.sign = x.used == 0 ? MP_ZPOS : a->sign;

  if (c != NULL) {
    mp_clamp (&q);
    mp_exch (&q, c);
    c->sign = neg;
  }

  if (d != NULL) {
    mp_div_2d (&x, norm, &x, NULL);
    mp_exch (&x, d);
  }

  res = MP_OKAY;

LBL_Y:mp_clear (&y);
LBL_X:mp_clear (&x);
LBL_T2:mp_clear (&t2);
LBL_T1:mp_clear (&t1);
LBL_Q:mp_clear (&q);
  return res;
}